

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::log_console_create(uint argc)

{
  int iVar1;
  vm_val_t *__file;
  vm_val_t *pvVar2;
  char *pcVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined4 extraout_var;
  FILE *pFVar6;
  int in_EDI;
  vm_rcdesc rc;
  err_frame_t err_cur__;
  int hdl;
  CVmNetFile *nf;
  osfildef *fp;
  char *nm;
  size_t len;
  char *str;
  vm_obj_id_t obj;
  CCharmapToLocal *cmap;
  int width;
  vm_val_t *charset;
  vm_val_t *filespec;
  vm_val_t *in_stack_fffffffffffffe68;
  void *pvVar7;
  CCharmap *in_stack_fffffffffffffe70;
  undefined8 uVar8;
  uint in_stack_fffffffffffffe78;
  vm_obj_id_t in_stack_fffffffffffffe7c;
  CVmRun *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  CCharmapToLocal *in_stack_fffffffffffffe98;
  osfildef *in_stack_fffffffffffffea0;
  CVmNetFile *in_stack_fffffffffffffea8;
  CVmLogConsoleManager *in_stack_fffffffffffffeb0;
  uint local_140 [2];
  undefined8 local_138;
  void *local_130;
  char *in_stack_ffffffffffffff30;
  CResLoader *in_stack_ffffffffffffff38;
  int local_5c;
  CCharmapToLocal *local_28;
  
  CVmBif::check_argc(0,0x3046bf);
  __file = CVmStack::get(0);
  pvVar2 = CVmStack::get(1);
  CVmStack::get(2);
  vm_val_t::num_to_int((vm_val_t *)in_stack_fffffffffffffe70);
  if (pvVar2->typ == VM_NIL) {
    local_28 = G_cmap_to_log_X;
    CCharmap::add_ref(&G_cmap_to_log_X->super_CCharmap);
    iVar1 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  }
  else if ((pvVar2->typ == VM_OBJ) && (iVar1 = CVmObjCharSet::is_charset(0), iVar1 != 0)) {
    vm_objp(0);
    iVar1 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    local_28 = CVmObjCharSet::get_to_local((CVmObjCharSet *)in_stack_fffffffffffffe70);
    CCharmap::add_ref(&local_28->super_CCharmap);
  }
  else {
    pcVar3 = vm_val_t::get_as_string(in_stack_fffffffffffffe68);
    iVar1 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (pcVar3 == (char *)0x0) {
      err_throw(0);
    }
    vmb_get_len((char *)0x3047d1);
    lib_copy_str((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (size_t)in_stack_fffffffffffffe70);
    (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
    local_28 = CCharmapToLocal::load(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    lib_free_str((char *)0x30483f);
  }
  if (local_28 == (CCharmapToLocal *)0x0) {
    (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
    CCharmapToLocal::load(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  local_5c = 0;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_138 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_140;
  local_140[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffed8);
  if (local_140[0] == 0) {
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,(vm_bif_desc *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7c,(vm_val_t *)in_stack_fffffffffffffe70,iVar1);
    iVar1 = CVmNetFile::open((char *)__file,(int)&stack0xfffffffffffffe78,0xe,2,"text/plain");
    CVmObjFile::check_safety_for_open
              ((CVmNetFile *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    pFVar6 = fopen(*(char **)CONCAT44(extraout_var,iVar1),"w");
    if (pFVar6 == (FILE *)0x0) {
      CVmRun::throw_new_class
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                 (char *)in_stack_fffffffffffffe70);
    }
    CVmConsoleMain::get_log_console_manager(G_console_X);
    local_5c = CVmLogConsoleManager::create_log_console
                         (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                          in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          in_stack_fffffffffffffe94);
  }
  if ((local_140[0] & 0x8000) == 0) {
    local_140[0] = local_140[0] | 0x8000;
    CCharmap::release_ref(in_stack_fffffffffffffe70);
  }
  uVar8 = local_138;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar8;
  if ((local_140[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar7 = local_130;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar7;
    err_rethrow();
  }
  if ((local_140[0] & 2) != 0) {
    free(local_130);
  }
  CVmStack::discard(in_EDI);
  if (local_5c == 0) {
    CVmBif::retval_nil();
  }
  else {
    CVmBif::retval_int(0x304ad1);
  }
  return;
}

Assistant:

void CVmBifTIO::log_console_create(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 3);

    /* get the arguments: log file name, character set, and width */
    const vm_val_t *filespec = G_stk->get(0);
    const vm_val_t *charset = G_stk->get(1);
    int width = G_stk->get(2)->num_to_int(vmg0_);

    /* 
     *   Retrieve the character mapper, which can be given as either a
     *   CharacterSet object or a string giving the character set name.  
     */
    CCharmapToLocal *cmap = 0;
    if (charset->typ == VM_NIL)
    {
        /* nil - use the default log file character set */
        cmap = G_cmap_to_log;
        cmap->add_ref();
    }
    else if (charset->typ == VM_OBJ
             && CVmObjCharSet::is_charset(vmg_ charset->val.obj))
    {
        /* it's a CharacterSet object - pop the reference */
        vm_obj_id_t obj = charset->val.obj;
        
        /* retrieve the character mapper from the character set */
        cmap = ((CVmObjCharSet *)vm_objp(vmg_ obj))->get_to_local(vmg0_);
        cmap->add_ref();
    }
    else
    {
        /* it's not a CharacterSet, so it must be a character set name */
        const char *str = charset->get_as_string(vmg0_);
        if (str == 0)
            err_throw(VMERR_BAD_TYPE_BIF);
        
        /* get the length and skip the length prefix */
        size_t len = vmb_get_len(str);
        str += VMB_LEN;

        /* get a null-terminated version of the name */
        char *nm = lib_copy_str(str, len);

        /* 
         *   Create a character mapping for the given name.  Note that this
         *   will automatically add a reference to the mapper on our behalf,
         *   so we don't have to add our own extra reference. 
         */
        cmap = CCharmapToLocal::load(G_host_ifc->get_sys_res_loader(), nm);

        /* done with the null-terminated version of the name string */
        lib_free_str(nm);
    }